

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.hpp
# Opt level: O2

Token * next(Token *__return_storage_ptr__,vector<Token,_std::allocator<Token>_> *input,int index)

{
  int iVar1;
  vector<Token,_std::allocator<Token>_> vStack_38;
  
  std::vector<Token,_std::allocator<Token>_>::vector(&vStack_38,input);
  iVar1 = nextIndex(&vStack_38,index);
  Token::Token(__return_storage_ptr__,
               (input->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
               super__Vector_impl_data._M_start + iVar1);
  std::vector<Token,_std::allocator<Token>_>::~vector(&vStack_38);
  return __return_storage_ptr__;
}

Assistant:

Token next(vector<Token> input, int index) {
	return input[nextIndex(input, index)];
}